

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
          (tree_clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *vectors,uint *weights,
          uint size,uint max_splits,bool generate_node_index_map,task_pool *pTask_pool)

{
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo> *this_00;
  vector<double> *this_01;
  ulong uVar1;
  uint *puVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  vec<16U,_float> *pvVar7;
  VectorInfo *pVVar8;
  double *pdVar9;
  raw_node *prVar10;
  byte bVar11;
  double dVar12;
  uint new_hash_size;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  hash_map_type *phVar24;
  bool bVar25;
  uint i_1;
  uint32 uVar26;
  vq_node *pvVar27;
  executable_task *pObj;
  value_type *pvVar28;
  vq_node *pvVar29;
  uint uVar30;
  uint i;
  uint uVar32;
  int iVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  undefined4 in_register_00000084;
  ulong uVar37;
  undefined7 in_register_00000089;
  vec<16U,_float> *pvVar38;
  vec<16U,_float> *pvVar39;
  uint uVar40;
  uint64 data;
  ulong uVar41;
  bool bVar42;
  float fVar43;
  float fVar44;
  uint end_node;
  vec<16U,_float> result;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
  params;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  node_queue;
  uint local_164;
  ulong local_160;
  uint local_154;
  vector<crnlib::vec<16U,_float>_> *local_150;
  node_vec_type *local_148;
  undefined4 local_13c;
  undefined1 local_138 [12];
  float fStack_12c;
  value_type local_128;
  value_type vStack_120;
  value_type local_118;
  value_type vStack_110;
  value_type local_108;
  value_type vStack_100;
  float local_f8 [4];
  insert_result local_e8;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  local_c8;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo> *local_a8;
  elemental_vector *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  float fStack_50;
  undefined4 uStack_4c;
  uint local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined2 local_38;
  undefined1 local_36;
  ulong uVar31;
  
  local_160 = CONCAT44(in_register_00000084,max_splits);
  local_13c = (undefined4)CONCAT71(in_register_00000089,generate_node_index_map);
  this->m_vectors = vectors;
  this_00 = &this->m_vectorsInfo;
  uVar30 = (this->m_vectorsInfo).m_size;
  if (uVar30 != size) {
    if ((uVar30 <= size) && ((this->m_vectorsInfo).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,size,uVar30 + 1 == size,8,(object_mover)0x0,false);
    }
    (this->m_vectorsInfo).m_size = size;
  }
  local_150 = &this->m_weightedVectors;
  uVar30 = (this->m_weightedVectors).m_size;
  if (uVar30 != size) {
    if ((uVar30 <= size) && ((this->m_weightedVectors).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)local_150,size,uVar30 + 1 == size,0x40,(object_mover)0x0,false)
      ;
    }
    (this->m_weightedVectors).m_size = size;
  }
  this_01 = &this->m_weightedDotProducts;
  uVar30 = (this->m_weightedDotProducts).m_size;
  local_a8 = this_00;
  if (uVar30 != size) {
    if (uVar30 <= size) {
      if ((this->m_weightedDotProducts).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_01,size,uVar30 + 1 == size,8,(object_mover)0x0,false);
        uVar30 = (this->m_weightedDotProducts).m_size;
      }
      memset(this_01->m_p + uVar30,0,(ulong)(size - uVar30) << 3);
    }
    (this->m_weightedDotProducts).m_size = size;
  }
  uVar30 = (this->m_vectorsInfoLeft).m_size;
  if (uVar30 != size) {
    if ((uVar30 <= size) && ((this->m_vectorsInfoLeft).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoLeft,size,uVar30 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoLeft).m_size = size;
  }
  uVar30 = (this->m_vectorsInfoRight).m_size;
  if (uVar30 != size) {
    if ((uVar30 <= size) && ((this->m_vectorsInfoRight).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoRight,size,uVar30 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoRight).m_size = size;
  }
  uVar30 = (this->m_vectorComparison).m_size;
  if (uVar30 != size) {
    if (uVar30 <= size) {
      if ((this->m_vectorComparison).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_vectorComparison,size,uVar30 + 1 == size,1,
                   (object_mover)0x0,false);
        uVar30 = (this->m_vectorComparison).m_size;
      }
      memset((this->m_vectorComparison).m_p + uVar30,0,(ulong)(size - uVar30));
    }
    (this->m_vectorComparison).m_size = size;
  }
  local_148 = &this->m_nodes;
  uVar32 = (int)local_160 * 4;
  uVar30 = (this->m_nodes).m_size;
  if (uVar30 != uVar32) {
    if (uVar30 <= uVar32) {
      if ((this->m_nodes).m_capacity < uVar32) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_148,uVar32,uVar30 + 1 == uVar32,0x68,
                   vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::object_mover
                   ,false);
        uVar30 = (this->m_nodes).m_size;
      }
      if (uVar32 - uVar30 != 0) {
        pvVar27 = local_148->m_p + uVar30;
        pvVar29 = pvVar27 + (uVar32 - uVar30);
        do {
          (pvVar27->m_centroid).m_s[0xc] = 0.0;
          (pvVar27->m_centroid).m_s[0xd] = 0.0;
          (pvVar27->m_centroid).m_s[0xe] = 0.0;
          (pvVar27->m_centroid).m_s[0xf] = 0.0;
          (pvVar27->m_centroid).m_s[8] = 0.0;
          (pvVar27->m_centroid).m_s[9] = 0.0;
          (pvVar27->m_centroid).m_s[10] = 0.0;
          (pvVar27->m_centroid).m_s[0xb] = 0.0;
          (pvVar27->m_centroid).m_s[4] = 0.0;
          (pvVar27->m_centroid).m_s[5] = 0.0;
          (pvVar27->m_centroid).m_s[6] = 0.0;
          (pvVar27->m_centroid).m_s[7] = 0.0;
          (pvVar27->m_centroid).m_s[0] = 0.0;
          (pvVar27->m_centroid).m_s[1] = 0.0;
          (pvVar27->m_centroid).m_s[2] = 0.0;
          (pvVar27->m_centroid).m_s[3] = 0.0;
          pvVar27->m_total_weight = 0;
          pvVar27->m_left = -1;
          pvVar27->m_right = -1;
          pvVar27->m_codebook_index = -1;
          pvVar27->m_unsplittable = false;
          pvVar27->m_alternative = false;
          pvVar27->m_processed = false;
          pvVar27 = pvVar27 + 1;
        } while (pvVar27 != pvVar29);
      }
    }
    (this->m_nodes).m_size = uVar32;
  }
  pvVar7 = (this->m_codebook).m_p;
  if (pvVar7 != (vec<16U,_float> *)0x0) {
    crnlib_free(pvVar7);
    (this->m_codebook).m_p = (vec<16U,_float> *)0x0;
    (this->m_codebook).m_size = 0;
    (this->m_codebook).m_capacity = 0;
  }
  if (pTask_pool == (task_pool *)0x0) {
    local_154 = 1;
  }
  else {
    local_154 = pTask_pool->m_num_threads + 1;
  }
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_58 = 0;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  local_38 = 0;
  local_36 = 0;
  uStack_4c = 0;
  uVar41 = (ulong)(this->m_vectorsInfo).m_size;
  uVar30 = (uint)local_160;
  if (uVar41 == 0) {
    dVar12 = 0.0;
    fVar43 = 0.0;
    local_98._0_4_ = 0.0;
  }
  else {
    pVVar8 = local_a8->m_p;
    pvVar7 = local_150->m_p;
    pdVar9 = this_01->m_p;
    dVar12 = 0.0;
    uVar37 = 0;
    local_58 = 0;
    pvVar38 = pvVar7;
    pvVar39 = vectors;
    do {
      pvVar28 = (value_type *)(pvVar7 + uVar37);
      pVVar8[uVar37].index = (uint)uVar37;
      uVar32 = weights[uVar37];
      fVar43 = (float)uVar32;
      pVVar8[uVar37].weight = uVar32;
      lVar34 = 0;
      do {
        pfVar3 = pvVar39->m_s + lVar34;
        fVar44 = pfVar3[1];
        fVar6 = pfVar3[2];
        fVar13 = pfVar3[3];
        lVar4 = lVar34 * 4;
        *(float *)(local_138 + lVar4) = *pfVar3 * fVar43;
        *(float *)(local_138 + lVar4 + 4) = fVar44 * fVar43;
        *(float *)(local_138 + lVar4 + 8) = fVar6 * fVar43;
        (&fStack_12c)[lVar34] = fVar13 * fVar43;
        lVar34 = lVar34 + 4;
      } while (lVar34 != 0x10);
      pvVar28[6] = local_108;
      pvVar28[7] = vStack_100;
      pvVar28[4] = local_118;
      pvVar28[5] = vStack_110;
      pvVar28[2] = local_128;
      pvVar28[3] = vStack_120;
      pvVar28->m_index = local_138._0_4_;
      pvVar28->m_variance = (float)local_138._4_4_;
      pvVar28[1] = stack0xfffffffffffffed0;
      lVar34 = 0;
      do {
        pfVar3 = pvVar38->m_s + lVar34;
        fVar44 = pfVar3[1];
        fVar6 = pfVar3[2];
        fVar13 = pfVar3[3];
        lVar4 = lVar34 * 4;
        fVar14 = *(float *)((long)&local_98 + lVar4 + 4);
        fVar15 = *(float *)((long)&uStack_90 + lVar4);
        fVar16 = *(float *)((long)&uStack_90 + lVar4 + 4);
        lVar5 = lVar34 * 4;
        *(float *)((long)&local_98 + lVar5) = *(float *)((long)&local_98 + lVar4) + *pfVar3;
        *(float *)((long)&local_98 + lVar5 + 4) = fVar14 + fVar44;
        *(float *)((long)&uStack_90 + lVar5) = fVar15 + fVar6;
        *(float *)((long)&uStack_90 + lVar5 + 4) = fVar16 + fVar13;
        lVar34 = lVar34 + 4;
      } while (lVar34 != 0x10);
      fVar44 = vectors[uVar37].m_s[0] * vectors[uVar37].m_s[0];
      lVar34 = 1;
      do {
        fVar44 = fVar44 + pvVar39->m_s[lVar34] * pvVar39->m_s[lVar34];
        lVar34 = lVar34 + 1;
      } while (lVar34 != 0x10);
      local_58 = local_58 + uVar32;
      pdVar9[uVar37] = (double)(fVar44 * fVar43);
      dVar12 = dVar12 + (double)(fVar44 * fVar43);
      uVar37 = uVar37 + 1;
      pvVar39 = pvVar39 + 1;
      pvVar38 = pvVar38 + 1;
    } while (uVar37 != uVar41);
    fVar43 = (float)local_58;
  }
  fVar44 = (float)local_98 * (float)local_98;
  lVar34 = 1;
  do {
    fVar6 = *(float *)((long)&local_98 + lVar34 * 4);
    fVar44 = fVar44 + fVar6 * fVar6;
    lVar34 = lVar34 + 1;
  } while (lVar34 != 0x10);
  fStack_50 = (float)(dVar12 - (double)(fVar44 / fVar43));
  fVar43 = 1.0 / fVar43;
  lVar34 = 0;
  do {
    lVar4 = lVar34 * 4;
    fVar44 = *(float *)((long)&local_98 + lVar4 + 4);
    fVar6 = *(float *)((long)&uStack_90 + lVar4);
    fVar13 = *(float *)((long)&uStack_90 + lVar4 + 4);
    lVar5 = lVar34 * 4;
    *(float *)((long)&local_98 + lVar5) = *(float *)((long)&local_98 + lVar4) * fVar43;
    *(float *)((long)&local_98 + lVar5 + 4) = fVar44 * fVar43;
    *(float *)((long)&uStack_90 + lVar5) = fVar6 * fVar43;
    *(float *)((long)&uStack_90 + lVar5 + 4) = fVar13 * fVar43;
    lVar34 = lVar34 + 4;
  } while (lVar34 != 0x10);
  local_c8.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_164 = 0;
  pvVar27 = local_148->m_p;
  *(undefined8 *)((pvVar27->m_centroid).m_s + 0xc) = local_68;
  *(undefined8 *)((pvVar27->m_centroid).m_s + 0xe) = uStack_60;
  *(undefined8 *)((pvVar27->m_centroid).m_s + 8) = local_78;
  *(undefined8 *)((pvVar27->m_centroid).m_s + 10) = uStack_70;
  *(undefined8 *)((pvVar27->m_centroid).m_s + 4) = local_88;
  *(undefined8 *)((pvVar27->m_centroid).m_s + 6) = uStack_80;
  *(undefined8 *)(pvVar27->m_centroid).m_s = local_98;
  *(undefined8 *)((pvVar27->m_centroid).m_s + 2) = uStack_90;
  *(undefined4 *)((long)&pvVar27->m_codebook_index + 3) = 0xff;
  pvVar27->m_end = size;
  pvVar27->m_left = 0xffffffff;
  pvVar27->m_right = -1;
  pvVar27->m_codebook_index = -1;
  pvVar27->m_total_weight = local_58;
  pvVar27->m_variance = (float)(int)(ulong)(uint)fStack_50;
  pvVar27->m_begin = (int)((ulong)(uint)fStack_50 >> 0x20);
  local_138._0_8_ = (ulong)(uint)fStack_50 << 0x20;
  local_a0 = (elemental_vector *)&this->m_codebook;
  local_48 = size;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ::push(&local_c8,(value_type *)local_138);
  local_164 = local_164 + 1;
  uVar40 = 1;
  uVar32 = uVar40;
  if (1 < local_154) {
    uVar41 = (ulong)local_154;
    if (1 < uVar30) {
      do {
        uVar32 = uVar40;
        if (((long)local_c8.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_c8.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar41) ||
           (bVar25 = split_node(this,&local_c8,&local_164,pTask_pool), !bVar25)) break;
        uVar40 = uVar40 + 1;
        uVar32 = (uint)local_160;
      } while ((uint)local_160 != uVar40);
    }
    if ((long)local_c8.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_c8.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar41) {
      std::
      vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
      ::vector((vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                *)local_138,&local_c8.c);
      uVar30 = local_154;
      local_150 = (vector<crnlib::vec<16U,_float>_> *)
                  CONCAT44(local_150._4_4_,(int)((local_160 & 0xffffffff) / (ulong)local_154));
      local_e8.first.m_pTable = (hash_map_type *)0x0;
      local_e8.first.m_index = 0;
      local_e8.first._12_4_ = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_e8,local_154,false,0xc,(object_mover)0x0,false);
      local_e8.first.m_index = uVar30;
      if ((value_type)local_138._0_8_ != stack0xfffffffffffffed0) {
        iVar33 = (int)local_160 * 2;
        local_154 = (uint)local_150 * 2;
        data = 0;
        do {
          phVar24 = local_e8.first.m_pTable;
          *(undefined4 *)((long)&((local_e8.first.m_pTable)->m_values).m_p + data * 0xc) =
               *(undefined4 *)local_138._0_8_;
          *(int *)((long)&((local_e8.first.m_pTable)->m_values).m_p + data * 0xc + 4) = iVar33;
          (&((local_e8.first.m_pTable)->m_values).m_size)[data * 3] = (uint)local_150;
          pObj = (executable_task *)crnlib_malloc(0x28);
          pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001d2a50;
          pObj[1]._vptr_executable_task = (_func_int **)this;
          pObj[2]._vptr_executable_task = (_func_int **)split_alternative_node_task;
          pObj[3]._vptr_executable_task = (_func_int **)0x0;
          *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
          task_pool::queue_task
                    (pTask_pool,pObj,data,(void *)((long)&(phVar24->m_values).m_p + data * 0xc));
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
          ::pop((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                 *)local_138);
          iVar33 = iVar33 + local_154;
          data = (uint64)((int)data + 1);
        } while ((value_type)local_138._0_8_ != stack0xfffffffffffffed0);
      }
      task_pool::join(pTask_pool);
      if (local_e8.first.m_pTable != (hash_map_type *)0x0) {
        crnlib_free(local_e8.first.m_pTable);
      }
      uVar30 = (uint)local_160;
      if ((value_type)local_138._0_8_ != (value_type)0x0) {
        operator_delete((void *)local_138._0_8_);
      }
    }
    else {
      uVar30 = (uint)local_160;
    }
  }
  if (uVar32 < uVar30) {
    iVar33 = ~uVar32 + uVar30;
    do {
      bVar25 = split_node(this,&local_c8,&local_164,pTask_pool);
      bVar42 = iVar33 != 0;
      iVar33 = iVar33 + -1;
    } while (bVar25 && bVar42);
  }
  if (local_164 != 0) {
    uVar41 = 0;
    do {
      pvVar27 = local_148->m_p;
      if ((pvVar27[uVar41].m_alternative != false) || (pvVar27[uVar41].m_left == -1)) {
        pvVar27 = pvVar27 + uVar41;
        uVar30 = (this->m_codebook).m_size;
        pvVar27->m_codebook_index = uVar30;
        if ((this->m_codebook).m_capacity <= uVar30) {
          elemental_vector::increase_capacity(local_a0,uVar30 + 1,true,0x40,(object_mover)0x0,false)
          ;
          uVar30 = (this->m_codebook).m_size;
        }
        pvVar7 = (this->m_codebook).m_p;
        uVar17 = *(undefined8 *)(pvVar27->m_centroid).m_s;
        uVar18 = *(undefined8 *)((pvVar27->m_centroid).m_s + 2);
        uVar19 = *(undefined8 *)((pvVar27->m_centroid).m_s + 4);
        uVar20 = *(undefined8 *)((pvVar27->m_centroid).m_s + 6);
        uVar21 = *(undefined8 *)((pvVar27->m_centroid).m_s + 8);
        uVar22 = *(undefined8 *)((pvVar27->m_centroid).m_s + 10);
        uVar23 = *(undefined8 *)((pvVar27->m_centroid).m_s + 0xe);
        *(undefined8 *)(pvVar7[uVar30].m_s + 0xc) = *(undefined8 *)((pvVar27->m_centroid).m_s + 0xc)
        ;
        *(undefined8 *)(pvVar7[uVar30].m_s + 0xc + 2) = uVar23;
        *(undefined8 *)(pvVar7[uVar30].m_s + 8) = uVar21;
        *(undefined8 *)(pvVar7[uVar30].m_s + 8 + 2) = uVar22;
        *(undefined8 *)(pvVar7[uVar30].m_s + 4) = uVar19;
        *(undefined8 *)(pvVar7[uVar30].m_s + 4 + 2) = uVar20;
        *(undefined8 *)pvVar7[uVar30].m_s = uVar17;
        *(undefined8 *)(pvVar7[uVar30].m_s + 2) = uVar18;
        puVar2 = &(this->m_codebook).m_size;
        *puVar2 = *puVar2 + 1;
        if (((char)local_13c != '\0') &&
           (uVar37 = (ulong)pvVar27->m_begin, pvVar27->m_begin < pvVar27->m_end)) {
          do {
            pvVar7 = this->m_vectors;
            uVar30 = (this->m_vectorsInfo).m_p[uVar37].index;
            local_f8[0] = (float)pvVar27->m_codebook_index;
            local_138._0_8_ = *(value_type *)(pvVar7 + uVar30);
            unique0x10000dfd = ((value_type *)(pvVar7 + uVar30))[1];
            local_128 = *(value_type *)(pvVar7[uVar30].m_s + 4);
            vStack_120 = ((value_type *)(pvVar7[uVar30].m_s + 4))[1];
            local_118 = *(value_type *)(pvVar7[uVar30].m_s + 8);
            vStack_110 = ((value_type *)(pvVar7[uVar30].m_s + 8))[1];
            local_108 = *(value_type *)(pvVar7[uVar30].m_s + 0xc);
            vStack_100 = ((value_type *)(pvVar7[uVar30].m_s + 0xc))[1];
            local_e8.first.m_pTable = (hash_map_type *)0x0;
            local_e8.first._8_8_ = local_e8.first._8_8_ & 0xffffffff00000000;
            local_e8.second = false;
            if ((this->m_node_index_map).m_values.m_size == 0) {
              uVar35 = 0;
LAB_001816ef:
              new_hash_size = uVar35 * 2;
              if (uVar35 * 2 < 5) {
                new_hash_size = 4;
              }
              hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
              ::rehash(&this->m_node_index_map,new_hash_size);
              bVar25 = hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
                       ::insert_no_grow(&this->m_node_index_map,&local_e8,
                                        (vec<16U,_float> *)local_138,(uint *)local_f8);
              if (!bVar25) {
                crnlib_fail("\"insert() failed\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_hash_map.h"
                            ,0x204);
              }
            }
            else {
              uVar26 = fast_hash((vec<16U,_float> *)local_138,0x40);
              bVar11 = (byte)(this->m_node_index_map).m_hash_shift & 0x1f;
              uVar30 = uVar26 * -0x61c88647 >> bVar11;
              uVar31 = (ulong)uVar30;
              prVar10 = (this->m_node_index_map).m_values.m_p;
              pvVar28 = (value_type *)(prVar10 + uVar31);
              if (*(char *)&pvVar28[8].m_variance != '\0') {
                if (((float)pvVar28->m_index == (float)local_138._0_4_) &&
                   (!NAN((float)pvVar28->m_index) && !NAN((float)local_138._0_4_))) {
                  uVar36 = 0xffffffffffffffff;
                  do {
                    if (uVar36 == 0xe) goto LAB_00181738;
                    lVar34 = uVar36 * 4;
                    uVar1 = uVar36 + 1;
                    lVar4 = uVar36 * 4;
                  } while ((*(float *)(prVar10[uVar31].m_bits + lVar34 + 8) ==
                            *(float *)(local_138 + lVar4 + 8)) &&
                          (uVar36 = uVar1,
                          !NAN(*(float *)(prVar10[uVar31].m_bits + lVar34 + 8)) &&
                          !NAN(*(float *)(local_138 + lVar4 + 8))));
                  if (0xe < uVar1) goto LAB_00181738;
                }
                uVar35 = (this->m_node_index_map).m_values.m_size;
                uVar40 = uVar35 - 1;
                uVar32 = uVar30 - 1;
                if (uVar31 == 0) {
                  uVar32 = uVar40;
                }
                if (uVar30 != uVar32) {
                  pvVar28 = pvVar28 + -9;
                  if (uVar26 * -0x61c88647 >> bVar11 == 0) {
                    pvVar28 = (value_type *)(prVar10 + uVar40);
                  }
                  do {
                    if (*(char *)&pvVar28[8].m_variance == '\0') goto LAB_0018166a;
                    if (((float)pvVar28->m_index == (float)local_138._0_4_) &&
                       (!NAN((float)pvVar28->m_index) && !NAN((float)local_138._0_4_))) {
                      uVar31 = 0xffffffffffffffff;
                      do {
                        if (uVar31 == 0xe) goto LAB_00181738;
                        puVar2 = &pvVar28[1].m_index + uVar31;
                        uVar36 = uVar31 + 1;
                        lVar34 = uVar31 * 4;
                      } while (((float)*puVar2 == *(float *)(local_138 + lVar34 + 8)) &&
                              (uVar31 = uVar36,
                              !NAN((float)*puVar2) && !NAN(*(float *)(local_138 + lVar34 + 8))));
                      if (0xe < uVar36) goto LAB_00181738;
                    }
                    bVar25 = uVar32 == 0;
                    pvVar28 = pvVar28 + -9;
                    uVar32 = uVar32 - 1;
                    if (bVar25) {
                      pvVar28 = (value_type *)(prVar10 + uVar40);
                      uVar32 = uVar40;
                    }
                  } while (uVar30 != uVar32);
                }
                goto LAB_001816ef;
              }
LAB_0018166a:
              if ((this->m_node_index_map).m_grow_threshold <= (this->m_node_index_map).m_num_valid)
              {
                uVar35 = (this->m_node_index_map).m_values.m_size;
                goto LAB_001816ef;
              }
              pvVar28[6] = local_108;
              pvVar28[7] = vStack_100;
              pvVar28[4] = local_118;
              pvVar28[5] = vStack_110;
              pvVar28[2] = local_128;
              pvVar28[3] = vStack_120;
              pvVar28->m_index = local_138._0_4_;
              pvVar28->m_variance = (float)local_138._4_4_;
              pvVar28[1] = stack0xfffffffffffffed0;
              pvVar28[8].m_index = (uint)local_f8[0];
              *(undefined1 *)&pvVar28[8].m_variance = 1;
              puVar2 = &(this->m_node_index_map).m_num_valid;
              *puVar2 = *puVar2 + 1;
            }
LAB_00181738:
            uVar37 = uVar37 + 1;
          } while (uVar37 < pvVar27->m_end);
        }
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 < local_164);
  }
  if (local_c8.c.
      super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.c.
                    super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void generate_codebook(VectorType* vectors, uint* weights, uint size, uint max_splits, bool generate_node_index_map = false, task_pool* pTask_pool = 0)
        {
            m_vectors = vectors;
            m_vectorsInfo.resize(size);
            m_weightedVectors.resize(size);
            m_weightedDotProducts.resize(size);
            m_vectorsInfoLeft.resize(size);
            m_vectorsInfoRight.resize(size);
            m_vectorComparison.resize(size);
            m_nodes.resize(max_splits << 2);
            m_codebook.clear();
            uint num_tasks = pTask_pool ? pTask_pool->get_num_threads() + 1 : 1;

            vq_node root;
            root.m_begin = 0;
            root.m_end = size;
            double ttsum = 0.0f;
            for (uint i = 0; i < m_vectorsInfo.size(); i++)
            {
                const VectorType& v = vectors[i];
                m_vectorsInfo[i].index = i;
                const uint weight = m_vectorsInfo[i].weight = weights[i];
                m_weightedVectors[i] = v * (float)weight;
                root.m_centroid += m_weightedVectors[i];
                root.m_total_weight += weight;
                m_weightedDotProducts[i] = v.dot(v) * weight;
                ttsum += m_weightedDotProducts[i];
            }
            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));
            root.m_centroid *= (1.0f / root.m_total_weight);

            std::priority_queue<NodeInfo> node_queue;
            uint begin_node = 0, end_node = begin_node, splits = 0;
            m_nodes[end_node] = root;
            node_queue.push(NodeInfo(end_node, root.m_variance));
            end_node++;
            splits++;

            if (num_tasks > 1)
            {
                while (splits < max_splits && node_queue.size() != num_tasks && split_node(node_queue, end_node, pTask_pool))
                {
                    splits++;
                }
                if (node_queue.size() == num_tasks)
                {
                    std::priority_queue<NodeInfo> alternative_node_queue = node_queue;
                    uint alternative_node = max_splits << 1, alternative_max_splits = max_splits / num_tasks;
                    crnlib::vector<split_alternative_node_task_params> params(num_tasks);
                    for (uint task = 0; !alternative_node_queue.empty(); alternative_node_queue.pop(), alternative_node += alternative_max_splits << 1, task++)
                    {
                        params[task].main_node = alternative_node_queue.top().m_index;
                        params[task].alternative_node = alternative_node;
                        params[task].max_splits = alternative_max_splits;
                        pTask_pool->queue_object_task(this, &tree_clusterizer::split_alternative_node_task, task, &params[task]);
                    }
                    pTask_pool->join();
                }
            }

            while (splits < max_splits && split_node(node_queue, end_node, pTask_pool))
            {
                splits++;
            }

            for (uint i = begin_node; i < end_node; i++)
            {
                vq_node& node = m_nodes[i];
                if (!node.m_alternative && node.m_left != -1)
                {
                    continue;
                }
                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);
                if (generate_node_index_map)
                {
                    for (uint j = node.m_begin; j < node.m_end; j++)
                    {
                        m_node_index_map.insert(std::make_pair(m_vectors[m_vectorsInfo[j].index], node.m_codebook_index));
                    }
                }
            }
        }